

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_retcode.c
# Opt level: O0

void TA_SetRetCodeInfo(TA_RetCode theRetCode,TA_RetCodeInfo *retCodeInfo)

{
  uint local_1c;
  uint i;
  TA_RetCodeInfo *retCodeInfo_local;
  TA_RetCode theRetCode_local;
  
  if ((theRetCode < TA_INTERNAL_ERROR) || (5999 < theRetCode)) {
    for (local_1c = 0; local_1c < 0x12; local_1c = local_1c + 1) {
      if (theRetCode == retCodeInfoTable[local_1c].retCode) {
        retCodeInfo->enumStr = retCodeInfoTable[local_1c].enumStr;
        retCodeInfo->infoStr = retCodeInfoTable[local_1c].infoStr;
        return;
      }
    }
    retCodeInfo->enumStr = retCodeInfoTable[local_1c].enumStr;
    retCodeInfo->infoStr = retCodeInfoTable[local_1c].infoStr;
  }
  else {
    retCodeInfo->enumStr = "TA_INTERNAL_ERROR";
    retCodeInfo->infoStr = "Unexpected Internal Error - Contact TA-Lib.org";
  }
  return;
}

Assistant:

void TA_SetRetCodeInfo( TA_RetCode theRetCode, TA_RetCodeInfo *retCodeInfo )
{
   unsigned int i;
   
   /* Trap internal error code */
   if( (theRetCode >= 5000) && (theRetCode <= 5999) )
   {
      retCodeInfo->enumStr = "TA_INTERNAL_ERROR";
      retCodeInfo->infoStr = "Unexpected Internal Error - Contact TA-Lib.org";
      return;
   }
   
   /* Check among all the error code defined in ta_common.h */
   for( i=0; i < (NB_RET_CODE_INFO-1); i++ )
   {
      if( theRetCode == retCodeInfoTable[i].retCode )
      {
         /* Error code found. */
         retCodeInfo->enumStr = retCodeInfoTable[i].enumStr;
         retCodeInfo->infoStr = retCodeInfoTable[i].infoStr;
         return;
      }
   }

   /* Error code not found. */

   /* "TA_UNKNOWN_ERR" is ALWAYS the last entry in the table. */
   retCodeInfo->enumStr = retCodeInfoTable[i].enumStr;
   retCodeInfo->infoStr = retCodeInfoTable[i].infoStr;
}